

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O3

void __thiscall
embree::sse2::BVHNBuilderSAHQuantized<4,_embree::TriangleMi<4>_>::build
          (BVHNBuilderSAHQuantized<4,_embree::TriangleMi<4>_> *this)

{
  size_t *psVar1;
  mvector<PrimRef> *prims;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  pointer ppTVar5;
  Device *pDVar6;
  Block *pBVar7;
  PrimRef *pPVar8;
  MemoryMonitorInterface *pMVar9;
  Scene *pSVar10;
  GTypeMask GVar11;
  double t0;
  double dVar12;
  undefined8 uVar13;
  long lVar14;
  Geometry *pGVar15;
  long *plVar16;
  PrimRef *pPVar17;
  size_t sVar18;
  NodeRef root;
  uint uVar19;
  long *plVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  ulong uVar22;
  BVH **ppBVar23;
  __pointer_type pBVar24;
  pointer ppTVar25;
  size_t sVar26;
  ulong uVar27;
  ulong uVar28;
  BVH *pBVar29;
  string __str;
  PrimInfo pinfo;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [3];
  long local_88;
  long local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  pGVar15 = this->mesh;
  if (pGVar15 == (Geometry *)0x0) {
LAB_00bfca49:
    pSVar10 = this->scene;
    GVar11 = this->gtype_;
    uVar19 = (uint)GVar11;
    if ((uVar19 >> 0x14 & 1) == 0) {
      sVar18 = 0;
    }
    else {
      sVar18 = (pSVar10->world).numTriangles;
    }
    if ((uVar19 >> 0x15 & 1) != 0) {
      sVar18 = sVar18 + (pSVar10->world).numQuads;
    }
    if ((GVar11 & MTY_CURVE2) != ~MTY_ALL) {
      sVar18 = sVar18 + (pSVar10->world).numLineSegments;
    }
    if ((GVar11 & MTY_CURVE4) != ~MTY_ALL) {
      sVar18 = sVar18 + (pSVar10->world).numBezierCurves;
    }
    if ((GVar11 & MTY_POINTS) != ~MTY_ALL) {
      sVar18 = sVar18 + (pSVar10->world).numPoints;
    }
    if ((uVar19 >> 0x17 & 1) != 0) {
      sVar18 = sVar18 + (pSVar10->world).numSubdivPatches;
    }
    if ((uVar19 >> 0x1d & 1) != 0) {
      sVar18 = sVar18 + (pSVar10->world).numUserGeometries;
    }
    if ((uVar19 >> 0x1e & 1) != 0) {
      sVar18 = sVar18 + (pSVar10->world).numInstancesCheap;
    }
    if ((int)uVar19 < 0) {
      sVar18 = sVar18 + (pSVar10->world).numInstancesExpensive;
    }
    if ((uVar19 >> 0x18 & 1) != 0) {
      sVar18 = sVar18 + (pSVar10->world).numInstanceArrays;
    }
    if ((uVar19 >> 0x16 & 1) != 0) {
      sVar18 = sVar18 + (pSVar10->world).numGrids;
    }
    this->numPreviousPrimitives = (uint)sVar18;
    if (sVar18 == 0) goto LAB_00bfcb6a;
    pBVar29 = this->bvh;
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct((ulong)local_e8,'\x01');
    *local_e8[0] = 0x34;
    plVar16 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x1f93209);
    local_108 = &local_f8;
    plVar20 = plVar16 + 2;
    if ((long *)*plVar16 == plVar20) {
      local_f8 = *plVar20;
      lStack_f0 = plVar16[3];
    }
    else {
      local_f8 = *plVar20;
      local_108 = (long *)*plVar16;
    }
    local_100 = plVar16[1];
    *plVar16 = (long)plVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_108);
    local_c8._0_8_ = local_b8;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar21) {
      local_b8[0]._0_8_ = paVar21->_M_allocated_capacity;
      local_b8[0]._8_8_ = plVar16[3];
    }
    else {
      local_b8[0]._0_8_ = paVar21->_M_allocated_capacity;
      local_c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar16;
    }
    local_c8._8_8_ = plVar16[1];
    *plVar16 = (long)paVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    bVar4 = true;
  }
  else {
    if (pGVar15->numPrimitives != this->numPreviousPrimitives) {
      pBVar29 = this->bvh;
      FastAllocator::internal_fix_used_blocks(&pBVar29->alloc);
      ppTVar25 = (pBVar29->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = (pBVar29->alloc).thread_local_allocators.
                super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar25 != ppTVar5) {
        do {
          FastAllocator::ThreadLocal2::unbind(*ppTVar25,&pBVar29->alloc);
          ppTVar25 = ppTVar25 + 1;
        } while (ppTVar25 != ppTVar5);
        ppTVar25 = (pBVar29->alloc).thread_local_allocators.
                   super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((pBVar29->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppTVar25) {
          (pBVar29->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppTVar25;
        }
      }
      LOCK();
      (pBVar29->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar29->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar29->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if ((pBVar29->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
        pDVar6 = (pBVar29->alloc).device;
        bVar4 = (pBVar29->alloc).useUSM;
        pBVar24 = (pBVar29->alloc).usedBlocks._M_b._M_p;
        do {
          pBVar7 = pBVar24->next;
          FastAllocator::Block::clear_block(pBVar24,pDVar6,bVar4);
          pBVar24 = pBVar7;
        } while (pBVar7 != (Block *)0x0);
      }
      LOCK();
      (pBVar29->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((pBVar29->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
        pDVar6 = (pBVar29->alloc).device;
        bVar4 = (pBVar29->alloc).useUSM;
        pBVar24 = (pBVar29->alloc).freeBlocks._M_b._M_p;
        do {
          pBVar7 = pBVar24->next;
          FastAllocator::Block::clear_block(pBVar24,pDVar6,bVar4);
          pBVar24 = pBVar7;
        } while (pBVar7 != (Block *)0x0);
      }
      LOCK();
      (pBVar29->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar14 = -8;
      do {
        LOCK();
        (pBVar29->alloc).threadBlocks[lVar14]._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        LOCK();
        (pBVar29->alloc).threadBlocks[lVar14 + 8]._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0);
      sVar18 = (pBVar29->alloc).primrefarray.size_alloced;
      pPVar8 = (pBVar29->alloc).primrefarray.items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar18 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar18 << 5,(pBVar29->alloc).primrefarray.alloc.hugepages);
        }
      }
      if (sVar18 != 0) {
        pMVar9 = (pBVar29->alloc).primrefarray.alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar18 * -0x20,1);
      }
      (pBVar29->alloc).primrefarray.size_active = 0;
      (pBVar29->alloc).primrefarray.size_alloced = 0;
      (pBVar29->alloc).primrefarray.items = (PrimRef *)0x0;
      pGVar15 = this->mesh;
      if (pGVar15 == (Geometry *)0x0) goto LAB_00bfca49;
    }
    sVar18 = (size_t)pGVar15->numPrimitives;
    this->numPreviousPrimitives = pGVar15->numPrimitives;
    if (sVar18 == 0) {
LAB_00bfcb6a:
      sVar18 = (this->prims).size_alloced;
      pPVar8 = (this->prims).items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar18 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar18 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar18 != 0) {
        pMVar9 = (this->prims).alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar18 * -0x20,1);
      }
      (this->prims).size_active = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      return;
    }
    pBVar29 = this->bvh;
    local_c8._0_8_ = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    bVar4 = false;
  }
  ppBVar23 = &this->bvh;
  t0 = BVHN<4>::preBuild(pBVar29,(string *)&local_c8.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._0_8_ != local_b8) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (bVar4) {
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0]);
    }
  }
  uVar22 = (this->prims).size_alloced;
  uVar28 = uVar22;
  if ((uVar22 < sVar18) && (uVar28 = sVar18, uVar27 = uVar22, uVar22 != 0)) {
    do {
      uVar28 = uVar27 * 2 + (ulong)(uVar27 * 2 == 0);
      uVar27 = uVar28;
    } while (uVar28 < sVar18);
  }
  psVar1 = &(this->prims).size_active;
  if (sVar18 < (this->prims).size_active) {
    *psVar1 = sVar18;
  }
  prims = &this->prims;
  if (uVar22 == uVar28) {
    *psVar1 = sVar18;
    goto LAB_00bfcde9;
  }
  pMVar9 = (this->prims).alloc.device;
  pPVar8 = (this->prims).items;
  uVar22 = uVar28 << 5;
  (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar22,0);
  if (uVar22 < 0x1c00000) {
    pPVar17 = (PrimRef *)alignedMalloc(uVar22,0x20);
  }
  else {
    pPVar17 = (PrimRef *)os_malloc(uVar22,&(this->prims).alloc.hugepages);
  }
  (this->prims).items = pPVar17;
  if ((this->prims).size_active == 0) {
    sVar26 = (this->prims).size_alloced;
    if (pPVar8 != (PrimRef *)0x0) goto LAB_00bfcd94;
  }
  else {
    lVar14 = 0x10;
    uVar22 = 0;
    do {
      pPVar17 = (this->prims).items;
      puVar2 = (undefined8 *)((long)pPVar8 + lVar14 + -0x10);
      uVar13 = puVar2[1];
      puVar3 = (undefined8 *)((long)pPVar17 + lVar14 + -0x10);
      *puVar3 = *puVar2;
      puVar3[1] = uVar13;
      puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar14);
      uVar13 = puVar2[1];
      puVar3 = (undefined8 *)((long)&(pPVar17->lower).field_0 + lVar14);
      *puVar3 = *puVar2;
      puVar3[1] = uVar13;
      uVar22 = uVar22 + 1;
      lVar14 = lVar14 + 0x20;
    } while (uVar22 < (this->prims).size_active);
    sVar26 = (this->prims).size_alloced;
LAB_00bfcd94:
    if (sVar26 << 5 < 0x1c00000) {
      alignedFree(pPVar8);
    }
    else {
      os_free(pPVar8,sVar26 << 5,(this->prims).alloc.hugepages);
    }
  }
  if (sVar26 != 0) {
    pMVar9 = (prims->alloc).device;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar26 * -0x20,1);
  }
  (this->prims).size_active = sVar18;
  (this->prims).size_alloced = uVar28;
LAB_00bfcde9:
  if (this->mesh == (Geometry *)0x0) {
    sse2::createPrimRefArray
              ((PrimInfo *)&local_c8.field_1,this->scene,this->gtype_,false,sVar18,prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  else {
    sse2::createPrimRefArray
              ((PrimInfo *)&local_c8.field_1,this->mesh,this->geomID_,sVar18,prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  if (this->mesh != (Geometry *)0x0) {
    ((*ppBVar23)->alloc).atype = EMBREE_OS_MALLOC;
  }
  dVar12 = (double)(sVar18 + 3 >> 2) * 1.2 * 80.0;
  uVar22 = (ulong)dVar12;
  sVar26 = ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar22 >> 0x3f | uVar22) +
           (sVar18 * 0x50 >> 4);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar26);
  sVar18 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,sVar18,sVar26);
  (this->settings).singleThreadThreshold = sVar18;
  local_78._8_8_ = this->bvh;
  local_78._0_8_ = &PTR_createLeaf_0218ca28;
  root = BVHNBuilderQuantizedVirtual<4>::BVHNBuilderV::build
                   ((BVHNBuilderV *)&local_78.field_1,&((BVH *)local_78._8_8_)->alloc,
                    &(((BVH *)local_78._8_8_)->scene->progressInterface).super_BuildProgressMonitor,
                    (this->prims).items,(PrimInfo *)&local_c8.field_1,this->settings);
  local_78._0_8_ = local_c8._0_8_;
  local_78._8_8_ = local_c8._8_8_;
  local_68._0_8_ = local_b8[0]._M_allocated_capacity;
  local_68._8_8_ = local_b8[0]._8_8_;
  local_58._0_8_ = local_c8._0_8_;
  local_58._8_8_ = local_c8._8_8_;
  local_48._0_8_ = local_b8[0]._M_allocated_capacity;
  local_48._8_8_ = local_b8[0]._8_8_;
  BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78.field_1,local_80 - local_88);
  if ((this->scene != (Scene *)0x0) &&
     ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
    sVar18 = (this->prims).size_alloced;
    pPVar8 = (this->prims).items;
    if (pPVar8 != (PrimRef *)0x0) {
      root.ptr = sVar18 << 5;
      if (root.ptr < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,root.ptr,(this->prims).alloc.hugepages);
      }
    }
    if (sVar18 != 0) {
      pMVar9 = (prims->alloc).device;
      root.ptr = sVar18 * -0x20;
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,root.ptr,1);
    }
    *psVar1 = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  BVHN<4>::cleanup(*ppBVar23,(EVP_PKEY_CTX *)root.ptr);
  BVHN<4>::postBuild(*ppBVar23,t0);
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          prims.clear();
          bvh->clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::QBVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif
            /* create primref array */
            prims.resize(numPrimitives);
            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* call BVH builder */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::QuantizedNode)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            NodeRef root = BVHNBuilderQuantizedVirtual<N>::build(&bvh->alloc,CreateLeafQuantized<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            //bvh->layoutLargeNodes(pinfo.size()*0.005f); // FIXME: COPY LAYOUT FOR LARGE NODES !!!
#if PROFILE
          });
#endif

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }